

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O0

plugin loader_host_initialize(void)

{
  loader_impl descriptor;
  plugin p;
  type t;
  type_id id;
  loader_impl host;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  loader_impl in_stack_ffffffffffffffd8;
  type_conflict in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  int id_00;
  loader_impl plVar2;
  char *in_stack_fffffffffffffff8;
  plugin ppVar3;
  
  descriptor = loader_impl_create_host(in_stack_ffffffffffffffc8);
  if (descriptor == (loader_impl)0x0) {
    ppVar3 = (plugin)0x0;
  }
  else {
    iVar1 = 0;
    while (iVar1 < 0x13) {
      id_00 = iVar1;
      type_id_name(iVar1);
      in_stack_ffffffffffffffe0 =
           type_create(id_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       (type_impl_interface_singleton)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
      plVar2 = descriptor;
      if (in_stack_ffffffffffffffe0 != (type_conflict)0x0) {
        type_name(in_stack_ffffffffffffffe0);
        iVar1 = loader_impl_type_define
                          (in_stack_ffffffffffffffd8,
                           (char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(type)descriptor);
        if (iVar1 != 0) {
          type_destroy((type_conflict)0x132eee);
          goto LAB_00132f3b;
        }
      }
      descriptor = plVar2;
      iVar1 = id_00 + 1;
    }
    ppVar3 = plugin_create(in_stack_fffffffffffffff8,(plugin_descriptor)descriptor,
                           (void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe0,(_func_void_plugin *)in_stack_ffffffffffffffd8)
    ;
    if (ppVar3 == (plugin)0x0) {
LAB_00132f3b:
      loader_host_destroy((loader_impl)0x132f45);
      ppVar3 = (plugin)0x0;
    }
  }
  return ppVar3;
}

Assistant:

plugin loader_host_initialize(void)
{
	static const loader_tag tag = LOADER_HOST_NAME;
	loader_impl host = loader_impl_create_host(tag);
	type_id id;

	if (host == NULL)
	{
		return NULL;
	}

	for (id = 0; id < TYPE_SIZE; ++id)
	{
		type t = type_create(id, type_id_name(id), NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(host, type_name(t), t) != 0)
			{
				type_destroy(t);
				goto error;
			}
		}
	}

	plugin p = plugin_create(LOADER_HOST_NAME, NULL, NULL, host, &loader_host_destroy_dtor);

	if (p == NULL)
	{
		goto error;
	}

	return p;
error:
	loader_host_destroy(host);
	return NULL;
}